

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Sweep.c
# Opt level: O0

Vec_Ptr_t *
Llb_Nonlin4SweepPartitions(DdManager *dd,Aig_Man_t *pAig,Vec_Int_t *vOrder,int fTransition)

{
  Vec_Ptr_t *p;
  int iVar1;
  Vec_Ptr_t *vRoots_00;
  Aig_Obj_t *pAVar2;
  int local_3c;
  int i;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vRoots;
  int fTransition_local;
  Vec_Int_t *vOrder_local;
  Aig_Man_t *pAig_local;
  DdManager *dd_local;
  
  Aig_ManCleanData(pAig);
  vRoots_00 = Vec_PtrAlloc(100);
  if (fTransition == 0) {
    for (local_3c = 0; iVar1 = Saig_ManPoNum(pAig), local_3c < iVar1; local_3c = local_3c + 1) {
      pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,local_3c);
      Llb_Nonlin4SweepPartitions_rec(dd,pAVar2,vOrder,vRoots_00);
    }
  }
  else {
    for (local_3c = 0; iVar1 = Saig_ManRegNum(pAig), local_3c < iVar1; local_3c = local_3c + 1) {
      p = pAig->vCos;
      iVar1 = Saig_ManPoNum(pAig);
      pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p,local_3c + iVar1);
      Llb_Nonlin4SweepPartitions_rec(dd,pAVar2,vOrder,vRoots_00);
    }
  }
  for (local_3c = 0; iVar1 = Vec_PtrSize(pAig->vObjs), local_3c < iVar1; local_3c = local_3c + 1) {
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,local_3c);
    if (((pAVar2 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pAVar2), iVar1 != 0)) &&
       ((pAVar2->field_5).pData != (void *)0x0)) {
      Cudd_RecursiveDeref(dd,(DdNode *)(pAVar2->field_5).pData);
    }
  }
  return vRoots_00;
}

Assistant:

Vec_Ptr_t * Llb_Nonlin4SweepPartitions( DdManager * dd, Aig_Man_t * pAig, Vec_Int_t * vOrder, int fTransition )
{
    Vec_Ptr_t * vRoots;
    Aig_Obj_t * pObj;
    int i;
    Aig_ManCleanData( pAig );
    vRoots = Vec_PtrAlloc( 100 );
    if ( fTransition )
    {
        Saig_ManForEachLi( pAig, pObj, i )
            Llb_Nonlin4SweepPartitions_rec( dd, pObj, vOrder, vRoots );
    }
    else
    {
        Saig_ManForEachPo( pAig, pObj, i )
            Llb_Nonlin4SweepPartitions_rec( dd, pObj, vOrder, vRoots );
    }
    Aig_ManForEachNode( pAig, pObj, i )
        if ( pObj->pData )
            Cudd_RecursiveDeref( dd, (DdNode *)pObj->pData );
    return vRoots;
}